

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 80off.cpp
# Opt level: O1

void convertFile(string *inputfilename,string *outputfilename)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  MidiEventList *pMVar4;
  MidiEvent *pMVar5;
  size_t in_RCX;
  void *__buf;
  int i;
  int aTrack;
  int j;
  MidiFile midifile;
  MidiFile local_90;
  
  smf::MidiFile::MidiFile(&local_90,inputfilename);
  aTrack = 0;
  while( true ) {
    iVar2 = smf::MidiFile::getTrackCount(&local_90);
    if (iVar2 <= aTrack) break;
    iVar2 = 0;
    while( true ) {
      iVar3 = smf::MidiFile::getEventCount(&local_90,aTrack);
      if (iVar3 <= iVar2) break;
      pMVar4 = smf::MidiFile::operator[](&local_90,aTrack);
      pMVar5 = smf::MidiEventList::operator[](pMVar4,iVar2);
      bVar1 = smf::MidiMessage::isNoteOff(&pMVar5->super_MidiMessage);
      if (bVar1) {
        pMVar4 = smf::MidiFile::operator[](&local_90,aTrack);
        pMVar5 = smf::MidiEventList::operator[](pMVar4,iVar2);
        smf::MidiMessage::setCommandNibble(&pMVar5->super_MidiMessage,0x80);
      }
      iVar2 = iVar2 + 1;
    }
    aTrack = aTrack + 1;
  }
  smf::MidiFile::write(&local_90,(int)outputfilename,__buf,in_RCX);
  smf::MidiFile::~MidiFile(&local_90);
  return;
}

Assistant:

void convertFile(const string& inputfilename, const string& outputfilename) {
   MidiFile midifile(inputfilename);
   for (int i=0; i<midifile.getTrackCount(); i++) {
      for (int j=0; j<midifile.getEventCount(i); j++) {
         if (!midifile[i][j].isNoteOff()) {
            continue;
         }
         midifile[i][j].setCommandNibble(0x80);
      }
   }
   midifile.write(outputfilename);
}